

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegistryAccess.cpp
# Opt level: O0

RegistryEntry *
bhf::ads::RegistryEntry::Create
          (RegistryEntry *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer,nRegHive hive,
          uint32_t regFlag)

{
  uchar *__string;
  size_type sVar1;
  size_t sVar2;
  ulong uVar3;
  runtime_error *prVar4;
  byte *pbVar5;
  unsigned_long lineNumber;
  ulong local_50;
  size_t i;
  ulong uStack_40;
  uint32_t type;
  unsigned_long bytesLeft;
  size_t stringLen;
  uint32_t regFlag_local;
  nRegHive hive_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer_local;
  
  __string = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(buffer);
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(buffer);
  sVar2 = strnlen((char *)__string,sVar1);
  uVar3 = sVar2 + 1;
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(buffer);
  if (sVar1 < uVar3) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"missing string terminator for value or key.");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(buffer);
  if (sVar1 == uVar3) {
    if (regFlag != 0) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar4,"Got registry key from network, but we expected somthing else.");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&__return_storage_ptr__->buffer,buffer);
    __return_storage_ptr__->hive = hive;
    __return_storage_ptr__->keyLen = uVar3;
    __return_storage_ptr__->type = 0;
    __return_storage_ptr__->dataLen = 0;
  }
  else {
    if (regFlag != 0xc0000000) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar4,"Got registry value from network, but we expected something else.");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(buffer);
    uStack_40 = sVar1 - uVar3;
    i._4_4_ = 0;
    if (uStack_40 < 4) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"not enough bytes for type left");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    for (local_50 = 0; local_50 < 4; local_50 = local_50 + 1) {
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (buffer,uVar3 + local_50);
      i._4_4_ = ((uint)*pbVar5 << ((byte)(local_50 << 3) & 0x1f)) + i._4_4_;
      uStack_40 = uStack_40 - 1;
    }
    lineNumber = std::numeric_limits<unsigned_long>::max();
    VerifyDataLen(i._4_4_,uStack_40,lineNumber);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&__return_storage_ptr__->buffer,buffer);
    __return_storage_ptr__->hive = hive;
    __return_storage_ptr__->keyLen = 0;
    __return_storage_ptr__->type = i._4_4_;
    __return_storage_ptr__->dataLen = uStack_40;
  }
  return __return_storage_ptr__;
}

Assistant:

RegistryEntry RegistryEntry::Create(const std::vector<uint8_t>&& buffer, const nRegHive hive, const uint32_t regFlag)
{
    const auto stringLen = 1 + strnlen(reinterpret_cast<const char*>(buffer.data()), buffer.size());
    if (buffer.size() < stringLen) {
        throw std::runtime_error("missing string terminator for value or key.");
    }

    if (buffer.size() == stringLen) {
        // Registry key has only the name as a NULL terminated string
        if (regFlag != REGFLAG_ENUMKEYS) {
            throw std::runtime_error("Got registry key from network, but we expected somthing else.");
        }
        return RegistryEntry{ buffer, hive, stringLen, 0, 0 };
    }
    if (regFlag != REGFLAG_ENUMVALUE_VTD) {
        throw std::runtime_error("Got registry value from network, but we expected something else.");
    }

    auto bytesLeft = buffer.size() - stringLen;
    uint32_t type = 0;
    if (bytesLeft < sizeof(type)) {
        throw std::runtime_error("not enough bytes for type left");
    }

    for (size_t i = 0; i < sizeof(type); i++) {
        type += buffer[stringLen + i] << i * 8;
        --bytesLeft;
    }
    VerifyDataLen(type, bytesLeft, std::numeric_limits<size_t>::max());
    return RegistryEntry { buffer, hive, 0, type, bytesLeft };
}